

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blockfilter_tests.cpp
# Opt level: O0

void __thiscall blockfilter_tests::blockfilter_basic_test::test_method(blockfilter_basic_test *this)

{
  span<const_unsigned_char,_18446744073709551615UL> b;
  span<const_unsigned_char,_18446744073709551615UL> b_00;
  span<const_unsigned_char,_18446744073709551615UL> b_01;
  span<const_unsigned_char,_18446744073709551615UL> b_02;
  span<const_unsigned_char,_18446744073709551615UL> b_03;
  span<const_unsigned_char,_18446744073709551615UL> b_04;
  bool bVar1;
  uint256 *puVar2;
  long in_FS_OFFSET;
  CScript *script_1;
  CScript *__end1_1;
  CScript *__begin1_1;
  CScript (*__range1_1) [4];
  CScript *script;
  CScript *__end1;
  CScript *__begin1;
  CScript (*__range1) [5];
  GCSFilter *filter;
  DataStream stream;
  CBlockUndo block_undo;
  CMutableTransaction tx_2;
  CMutableTransaction tx_1;
  BlockFilter default_ctor_block_filter_2;
  BlockFilter default_ctor_block_filter_1;
  BlockFilter block_filter2;
  BlockFilter block_filter;
  CBlock block;
  CScript excluded_scripts [4];
  CScript included_scripts [5];
  char *in_stack_fffffffffffff298;
  BlockFilter *in_stack_fffffffffffff2a0;
  char *in_stack_fffffffffffff2a8;
  BlockFilter *in_stack_fffffffffffff2b0;
  CBlock *in_stack_fffffffffffff2b8;
  CTxOut *in_stack_fffffffffffff2c0;
  undefined4 in_stack_fffffffffffff2c8;
  opcodetype in_stack_fffffffffffff2cc;
  const_string *in_stack_fffffffffffff2d0;
  __extent_storage<18446744073709551615UL> in_stack_fffffffffffff2d8;
  const_iterator in_stack_fffffffffffff2e0;
  const_iterator in_stack_fffffffffffff2e8;
  CBlock *in_stack_fffffffffffff2f0;
  long *plVar3;
  undefined8 in_stack_fffffffffffff2f8;
  BlockFilterType filter_type;
  long *plVar4;
  BlockFilter *in_stack_fffffffffffff300;
  long *local_ce8;
  long *local_a60;
  long *local_a48;
  long *local_a18;
  long *local_9e8;
  const_string local_9b8 [2];
  lazy_ostream local_998 [2];
  assertion_result local_978 [2];
  undefined1 local_940 [16];
  undefined1 local_930 [70];
  undefined1 local_8ea [114];
  lazy_ostream local_878 [2];
  assertion_result local_858 [2];
  undefined1 local_820 [16];
  undefined1 local_810 [70];
  undefined1 local_7ca [106];
  undefined8 uStack_760;
  const_string local_758 [2];
  lazy_ostream local_738 [4];
  assertion_result local_6f8 [2];
  const_string local_6c0 [2];
  lazy_ostream local_6a0 [4];
  assertion_result local_660 [2];
  undefined1 local_625;
  undefined4 local_624;
  undefined8 local_620;
  undefined1 local_615;
  undefined4 local_614;
  undefined8 local_610;
  undefined1 local_605;
  undefined4 local_604;
  undefined8 local_600;
  undefined4 local_5bc;
  undefined4 local_5b8;
  undefined4 local_5b4;
  undefined4 local_574;
  undefined4 local_570;
  undefined4 local_56c;
  undefined1 local_529;
  undefined1 local_4f9;
  undefined1 local_4c9;
  undefined1 local_499;
  undefined1 local_469;
  undefined1 local_439;
  long local_128 [16];
  long local_a8 [20];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_a48 = local_a8;
  do {
    CScript::CScript((CScript *)in_stack_fffffffffffff298);
    local_a48 = local_a48 + 4;
  } while (local_a48 != &local_8);
  local_a60 = local_128;
  do {
    CScript::CScript((CScript *)in_stack_fffffffffffff298);
    filter_type = (BlockFilterType)((ulong)in_stack_fffffffffffff2f8 >> 0x38);
    local_a60 = local_a60 + 4;
  } while (local_a60 != local_a8);
  local_439 = 0x41;
  std::allocator<unsigned_char>::allocator((allocator<unsigned_char> *)in_stack_fffffffffffff298);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
             CONCAT44(in_stack_fffffffffffff2cc,in_stack_fffffffffffff2c8),
             (size_type)in_stack_fffffffffffff2c0,(value_type_conflict3 *)in_stack_fffffffffffff2b8,
             (allocator_type *)in_stack_fffffffffffff2b0);
  std::span<const_unsigned_char,_18446744073709551615UL>::
  span<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
            ((span<const_unsigned_char,_18446744073709551615UL> *)in_stack_fffffffffffff2a8,
             (vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffff2a0);
  b._M_extent._M_extent_value = in_stack_fffffffffffff2d8._M_extent_value;
  b._M_ptr = (pointer)in_stack_fffffffffffff2d0;
  CScript::operator<<((CScript *)in_stack_fffffffffffff2b8,b);
  CScript::operator<<((CScript *)in_stack_fffffffffffff2d0,in_stack_fffffffffffff2cc);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffff2a8);
  std::allocator<unsigned_char>::~allocator((allocator<unsigned_char> *)in_stack_fffffffffffff298);
  CScript::operator<<((CScript *)in_stack_fffffffffffff2d0,in_stack_fffffffffffff2cc);
  CScript::operator<<((CScript *)in_stack_fffffffffffff2d0,in_stack_fffffffffffff2cc);
  local_469 = 0x14;
  std::allocator<unsigned_char>::allocator((allocator<unsigned_char> *)in_stack_fffffffffffff298);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
             CONCAT44(in_stack_fffffffffffff2cc,in_stack_fffffffffffff2c8),
             (size_type)in_stack_fffffffffffff2c0,(value_type_conflict3 *)in_stack_fffffffffffff2b8,
             (allocator_type *)in_stack_fffffffffffff2b0);
  std::span<const_unsigned_char,_18446744073709551615UL>::
  span<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
            ((span<const_unsigned_char,_18446744073709551615UL> *)in_stack_fffffffffffff2a8,
             (vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffff2a0);
  b_00._M_extent._M_extent_value = in_stack_fffffffffffff2d8._M_extent_value;
  b_00._M_ptr = (pointer)in_stack_fffffffffffff2d0;
  CScript::operator<<((CScript *)in_stack_fffffffffffff2b8,b_00);
  CScript::operator<<((CScript *)in_stack_fffffffffffff2d0,in_stack_fffffffffffff2cc);
  CScript::operator<<((CScript *)in_stack_fffffffffffff2d0,in_stack_fffffffffffff2cc);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffff2a8);
  std::allocator<unsigned_char>::~allocator((allocator<unsigned_char> *)in_stack_fffffffffffff298);
  CScript::operator<<((CScript *)in_stack_fffffffffffff2d0,in_stack_fffffffffffff2cc);
  local_499 = 0x21;
  std::allocator<unsigned_char>::allocator((allocator<unsigned_char> *)in_stack_fffffffffffff298);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
             CONCAT44(in_stack_fffffffffffff2cc,in_stack_fffffffffffff2c8),
             (size_type)in_stack_fffffffffffff2c0,(value_type_conflict3 *)in_stack_fffffffffffff2b8,
             (allocator_type *)in_stack_fffffffffffff2b0);
  std::span<const_unsigned_char,_18446744073709551615UL>::
  span<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
            ((span<const_unsigned_char,_18446744073709551615UL> *)in_stack_fffffffffffff2a8,
             (vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffff2a0);
  b_01._M_extent._M_extent_value = in_stack_fffffffffffff2d8._M_extent_value;
  b_01._M_ptr = (pointer)in_stack_fffffffffffff2d0;
  CScript::operator<<((CScript *)in_stack_fffffffffffff2b8,b_01);
  CScript::operator<<((CScript *)in_stack_fffffffffffff2d0,in_stack_fffffffffffff2cc);
  CScript::operator<<((CScript *)in_stack_fffffffffffff2d0,in_stack_fffffffffffff2cc);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffff2a8);
  std::allocator<unsigned_char>::~allocator((allocator<unsigned_char> *)in_stack_fffffffffffff298);
  CScript::operator<<((CScript *)in_stack_fffffffffffff2d0,in_stack_fffffffffffff2cc);
  local_4c9 = 0x20;
  std::allocator<unsigned_char>::allocator((allocator<unsigned_char> *)in_stack_fffffffffffff298);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
             CONCAT44(in_stack_fffffffffffff2cc,in_stack_fffffffffffff2c8),
             (size_type)in_stack_fffffffffffff2c0,(value_type_conflict3 *)in_stack_fffffffffffff2b8,
             (allocator_type *)in_stack_fffffffffffff2b0);
  std::span<const_unsigned_char,_18446744073709551615UL>::
  span<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
            ((span<const_unsigned_char,_18446744073709551615UL> *)in_stack_fffffffffffff2a8,
             (vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffff2a0);
  b_02._M_extent._M_extent_value = in_stack_fffffffffffff2d8._M_extent_value;
  b_02._M_ptr = (pointer)in_stack_fffffffffffff2d0;
  CScript::operator<<((CScript *)in_stack_fffffffffffff2b8,b_02);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffff2a8);
  std::allocator<unsigned_char>::~allocator((allocator<unsigned_char> *)in_stack_fffffffffffff298);
  CScript::operator<<((CScript *)in_stack_fffffffffffff2d0,in_stack_fffffffffffff2cc);
  CScript::operator<<((CScript *)in_stack_fffffffffffff2d0,in_stack_fffffffffffff2cc);
  CScript::operator<<((CScript *)in_stack_fffffffffffff2d0,in_stack_fffffffffffff2cc);
  CScript::operator<<((CScript *)in_stack_fffffffffffff2d0,in_stack_fffffffffffff2cc);
  CScript::operator<<((CScript *)in_stack_fffffffffffff2d0,in_stack_fffffffffffff2cc);
  local_4f9 = 0x28;
  std::allocator<unsigned_char>::allocator((allocator<unsigned_char> *)in_stack_fffffffffffff298);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
             CONCAT44(in_stack_fffffffffffff2cc,in_stack_fffffffffffff2c8),
             (size_type)in_stack_fffffffffffff2c0,(value_type_conflict3 *)in_stack_fffffffffffff2b8,
             (allocator_type *)in_stack_fffffffffffff2b0);
  std::span<const_unsigned_char,_18446744073709551615UL>::
  span<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
            ((span<const_unsigned_char,_18446744073709551615UL> *)in_stack_fffffffffffff2a8,
             (vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffff2a0);
  b_03._M_extent._M_extent_value = in_stack_fffffffffffff2d8._M_extent_value;
  b_03._M_ptr = (pointer)in_stack_fffffffffffff2d0;
  CScript::operator<<((CScript *)in_stack_fffffffffffff2b8,b_03);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffff2a8);
  std::allocator<unsigned_char>::~allocator((allocator<unsigned_char> *)in_stack_fffffffffffff298);
  local_529 = 0x21;
  std::allocator<unsigned_char>::allocator((allocator<unsigned_char> *)in_stack_fffffffffffff298);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
             CONCAT44(in_stack_fffffffffffff2cc,in_stack_fffffffffffff2c8),
             (size_type)in_stack_fffffffffffff2c0,(value_type_conflict3 *)in_stack_fffffffffffff2b8,
             (allocator_type *)in_stack_fffffffffffff2b0);
  std::span<const_unsigned_char,_18446744073709551615UL>::
  span<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
            ((span<const_unsigned_char,_18446744073709551615UL> *)in_stack_fffffffffffff2a8,
             (vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffff2a0);
  b_04._M_extent._M_extent_value = in_stack_fffffffffffff2d8._M_extent_value;
  b_04._M_ptr = (pointer)in_stack_fffffffffffff2d0;
  CScript::operator<<((CScript *)in_stack_fffffffffffff2b8,b_04);
  CScript::operator<<((CScript *)in_stack_fffffffffffff2d0,in_stack_fffffffffffff2cc);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffff2a8);
  std::allocator<unsigned_char>::~allocator((allocator<unsigned_char> *)in_stack_fffffffffffff298);
  CScript::operator<<((CScript *)in_stack_fffffffffffff2d0,in_stack_fffffffffffff2cc);
  CScript::operator<<((CScript *)in_stack_fffffffffffff2d0,in_stack_fffffffffffff2cc);
  CScript::operator<<((CScript *)in_stack_fffffffffffff2d0,in_stack_fffffffffffff2cc);
  CScript::operator<<((CScript *)in_stack_fffffffffffff2d0,in_stack_fffffffffffff2cc);
  CScript::operator<<((CScript *)in_stack_fffffffffffff2d0,in_stack_fffffffffffff2cc);
  CMutableTransaction::CMutableTransaction((CMutableTransaction *)in_stack_fffffffffffff298);
  local_56c = 100;
  std::vector<CTxOut,std::allocator<CTxOut>>::emplace_back<int,CScript&>
            ((vector<CTxOut,_std::allocator<CTxOut>_> *)in_stack_fffffffffffff2b8,
             (int *)in_stack_fffffffffffff2b0,(CScript *)in_stack_fffffffffffff2a8);
  local_570 = 200;
  std::vector<CTxOut,std::allocator<CTxOut>>::emplace_back<int,CScript&>
            ((vector<CTxOut,_std::allocator<CTxOut>_> *)in_stack_fffffffffffff2b8,
             (int *)in_stack_fffffffffffff2b0,(CScript *)in_stack_fffffffffffff2a8);
  local_574 = 0;
  std::vector<CTxOut,std::allocator<CTxOut>>::emplace_back<int,CScript&>
            ((vector<CTxOut,_std::allocator<CTxOut>_> *)in_stack_fffffffffffff2b8,
             (int *)in_stack_fffffffffffff2b0,(CScript *)in_stack_fffffffffffff2a8);
  CMutableTransaction::CMutableTransaction((CMutableTransaction *)in_stack_fffffffffffff298);
  local_5b4 = 300;
  std::vector<CTxOut,std::allocator<CTxOut>>::emplace_back<int,CScript&>
            ((vector<CTxOut,_std::allocator<CTxOut>_> *)in_stack_fffffffffffff2b8,
             (int *)in_stack_fffffffffffff2b0,(CScript *)in_stack_fffffffffffff2a8);
  local_5b8 = 0;
  std::vector<CTxOut,std::allocator<CTxOut>>::emplace_back<int,CScript&>
            ((vector<CTxOut,_std::allocator<CTxOut>_> *)in_stack_fffffffffffff2b8,
             (int *)in_stack_fffffffffffff2b0,(CScript *)in_stack_fffffffffffff2a8);
  local_5bc = 400;
  std::vector<CTxOut,std::allocator<CTxOut>>::emplace_back<int,CScript&>
            ((vector<CTxOut,_std::allocator<CTxOut>_> *)in_stack_fffffffffffff2b8,
             (int *)in_stack_fffffffffffff2b0,(CScript *)in_stack_fffffffffffff2a8);
  CBlock::CBlock(in_stack_fffffffffffff2b8);
  MakeTransactionRef<CMutableTransaction&>((CMutableTransaction *)in_stack_fffffffffffff2a0);
  std::
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::push_back((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
               *)in_stack_fffffffffffff298,(value_type *)0x47824f);
  std::shared_ptr<const_CTransaction>::~shared_ptr
            ((shared_ptr<const_CTransaction> *)in_stack_fffffffffffff298);
  MakeTransactionRef<CMutableTransaction&>((CMutableTransaction *)in_stack_fffffffffffff2a0);
  std::
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::push_back((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
               *)in_stack_fffffffffffff298,(value_type *)0x47829a);
  std::shared_ptr<const_CTransaction>::~shared_ptr
            ((shared_ptr<const_CTransaction> *)in_stack_fffffffffffff298);
  CBlockUndo::CBlockUndo((CBlockUndo *)in_stack_fffffffffffff298);
  std::vector<CTxUndo,_std::allocator<CTxUndo>_>::emplace_back<>
            ((vector<CTxUndo,_std::allocator<CTxUndo>_> *)in_stack_fffffffffffff2a8);
  std::vector<CTxUndo,_std::allocator<CTxUndo>_>::back
            ((vector<CTxUndo,_std::allocator<CTxUndo>_> *)in_stack_fffffffffffff298);
  local_600 = 500;
  CScript::CScript((CScript *)in_stack_fffffffffffff298,(CScript *)0x478303);
  CTxOut::CTxOut((CTxOut *)in_stack_fffffffffffff2d8._M_extent_value,
                 (CAmount *)in_stack_fffffffffffff2d0,
                 (CScript *)CONCAT44(in_stack_fffffffffffff2cc,in_stack_fffffffffffff2c8));
  local_604 = 1000;
  local_605 = 1;
  std::vector<Coin,std::allocator<Coin>>::emplace_back<CTxOut,int,bool>
            ((vector<Coin,_std::allocator<Coin>_> *)
             CONCAT44(in_stack_fffffffffffff2cc,in_stack_fffffffffffff2c8),in_stack_fffffffffffff2c0
             ,(int *)in_stack_fffffffffffff2b8,(bool *)in_stack_fffffffffffff2b0);
  CTxOut::~CTxOut((CTxOut *)in_stack_fffffffffffff298);
  CScript::~CScript((CScript *)in_stack_fffffffffffff298);
  std::vector<CTxUndo,_std::allocator<CTxUndo>_>::back
            ((vector<CTxUndo,_std::allocator<CTxUndo>_> *)in_stack_fffffffffffff298);
  local_610 = 600;
  CScript::CScript((CScript *)in_stack_fffffffffffff298,(CScript *)0x4783ae);
  CTxOut::CTxOut((CTxOut *)in_stack_fffffffffffff2d8._M_extent_value,
                 (CAmount *)in_stack_fffffffffffff2d0,
                 (CScript *)CONCAT44(in_stack_fffffffffffff2cc,in_stack_fffffffffffff2c8));
  local_614 = 10000;
  local_615 = 0;
  std::vector<Coin,std::allocator<Coin>>::emplace_back<CTxOut,int,bool>
            ((vector<Coin,_std::allocator<Coin>_> *)
             CONCAT44(in_stack_fffffffffffff2cc,in_stack_fffffffffffff2c8),in_stack_fffffffffffff2c0
             ,(int *)in_stack_fffffffffffff2b8,(bool *)in_stack_fffffffffffff2b0);
  CTxOut::~CTxOut((CTxOut *)in_stack_fffffffffffff298);
  CScript::~CScript((CScript *)in_stack_fffffffffffff298);
  std::vector<CTxUndo,_std::allocator<CTxUndo>_>::back
            ((vector<CTxUndo,_std::allocator<CTxUndo>_> *)in_stack_fffffffffffff298);
  local_620 = 700;
  CScript::CScript((CScript *)in_stack_fffffffffffff298,(CScript *)0x478459);
  CTxOut::CTxOut((CTxOut *)in_stack_fffffffffffff2d8._M_extent_value,
                 (CAmount *)in_stack_fffffffffffff2d0,
                 (CScript *)CONCAT44(in_stack_fffffffffffff2cc,in_stack_fffffffffffff2c8));
  local_624 = 100000;
  local_625 = 0;
  std::vector<Coin,std::allocator<Coin>>::emplace_back<CTxOut,int,bool>
            ((vector<Coin,_std::allocator<Coin>_> *)
             CONCAT44(in_stack_fffffffffffff2cc,in_stack_fffffffffffff2c8),in_stack_fffffffffffff2c0
             ,(int *)in_stack_fffffffffffff2b8,(bool *)in_stack_fffffffffffff2b0);
  CTxOut::~CTxOut((CTxOut *)in_stack_fffffffffffff298);
  CScript::~CScript((CScript *)in_stack_fffffffffffff298);
  BlockFilter::BlockFilter
            (in_stack_fffffffffffff300,filter_type,in_stack_fffffffffffff2f0,
             (CBlockUndo *)in_stack_fffffffffffff2e8.ptr);
  BlockFilter::GetFilter((BlockFilter *)in_stack_fffffffffffff298);
  for (local_9e8 = local_a8; local_9e8 != &local_8; local_9e8 = local_9e8 + 4) {
    do {
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_fffffffffffff2a8,
                 (pointer)in_stack_fffffffffffff2a0,(unsigned_long)in_stack_fffffffffffff298);
      boost::unit_test::basic_cstring<const_char>::basic_cstring
                ((basic_cstring<const_char> *)in_stack_fffffffffffff298);
      boost::unit_test::unit_test_log_t::set_checkpoint
                ((unit_test_log_t *)in_stack_fffffffffffff2d8._M_extent_value,
                 in_stack_fffffffffffff2d0,
                 CONCAT44(in_stack_fffffffffffff2cc,in_stack_fffffffffffff2c8),
                 (const_string *)in_stack_fffffffffffff2c0);
      prevector<28U,_unsigned_char,_unsigned_int,_int>::begin
                ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)in_stack_fffffffffffff2a0);
      prevector<28U,_unsigned_char,_unsigned_int,_int>::end
                ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)in_stack_fffffffffffff2a0);
      std::allocator<unsigned_char>::allocator
                ((allocator<unsigned_char> *)in_stack_fffffffffffff298);
      std::vector<unsigned_char,std::allocator<unsigned_char>>::
      vector<prevector<28u,unsigned_char,unsigned_int,int>::const_iterator,void>
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                 CONCAT44(in_stack_fffffffffffff2cc,in_stack_fffffffffffff2c8),
                 in_stack_fffffffffffff2e8,in_stack_fffffffffffff2e0,
                 (allocator_type *)in_stack_fffffffffffff2c0);
      GCSFilter::Match((GCSFilter *)in_stack_fffffffffffff2b0,(Element *)in_stack_fffffffffffff2a8);
      boost::test_tools::assertion_result::assertion_result
                ((assertion_result *)in_stack_fffffffffffff2a8,
                 SUB81((ulong)in_stack_fffffffffffff2a0 >> 0x38,0));
      boost::unit_test::lazy_ostream::instance();
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_fffffffffffff2a8,
                 (pointer)in_stack_fffffffffffff2a0,(unsigned_long)in_stack_fffffffffffff298);
      boost::unit_test::operator<<
                ((lazy_ostream *)in_stack_fffffffffffff2a0,
                 (basic_cstring<const_char> *)in_stack_fffffffffffff298);
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_fffffffffffff2a8,
                 (pointer)in_stack_fffffffffffff2a0,(unsigned_long)in_stack_fffffffffffff298);
      in_stack_fffffffffffff298 = (char *)0x0;
      boost::test_tools::tt_detail::report_assertion
                (local_660,local_6a0,local_6c0,0x6a,CHECK,CHECK_PRED);
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
      ::~lazy_ostream_impl
                ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                  *)in_stack_fffffffffffff298);
      boost::test_tools::assertion_result::~assertion_result
                ((assertion_result *)in_stack_fffffffffffff298);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffff2a8)
      ;
      std::allocator<unsigned_char>::~allocator
                ((allocator<unsigned_char> *)in_stack_fffffffffffff298);
      bVar1 = boost::test_tools::tt_detail::dummy_cond();
    } while (bVar1);
  }
  for (local_a18 = local_128; local_a18 != local_a8; local_a18 = local_a18 + 4) {
    do {
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_fffffffffffff2a8,
                 (pointer)in_stack_fffffffffffff2a0,(unsigned_long)in_stack_fffffffffffff298);
      boost::unit_test::basic_cstring<const_char>::basic_cstring
                ((basic_cstring<const_char> *)in_stack_fffffffffffff298);
      boost::unit_test::unit_test_log_t::set_checkpoint
                ((unit_test_log_t *)in_stack_fffffffffffff2d8._M_extent_value,
                 in_stack_fffffffffffff2d0,
                 CONCAT44(in_stack_fffffffffffff2cc,in_stack_fffffffffffff2c8),
                 (const_string *)in_stack_fffffffffffff2c0);
      prevector<28U,_unsigned_char,_unsigned_int,_int>::begin
                ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)in_stack_fffffffffffff2a0);
      prevector<28U,_unsigned_char,_unsigned_int,_int>::end
                ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)in_stack_fffffffffffff2a0);
      std::allocator<unsigned_char>::allocator
                ((allocator<unsigned_char> *)in_stack_fffffffffffff298);
      std::vector<unsigned_char,std::allocator<unsigned_char>>::
      vector<prevector<28u,unsigned_char,unsigned_int,int>::const_iterator,void>
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                 CONCAT44(in_stack_fffffffffffff2cc,in_stack_fffffffffffff2c8),
                 in_stack_fffffffffffff2e8,in_stack_fffffffffffff2e0,
                 (allocator_type *)in_stack_fffffffffffff2c0);
      GCSFilter::Match((GCSFilter *)in_stack_fffffffffffff2b0,(Element *)in_stack_fffffffffffff2a8);
      boost::test_tools::assertion_result::assertion_result
                ((assertion_result *)in_stack_fffffffffffff2a8,
                 SUB81((ulong)in_stack_fffffffffffff2a0 >> 0x38,0));
      boost::unit_test::lazy_ostream::instance();
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_fffffffffffff2a8,
                 (pointer)in_stack_fffffffffffff2a0,(unsigned_long)in_stack_fffffffffffff298);
      boost::unit_test::operator<<
                ((lazy_ostream *)in_stack_fffffffffffff2a0,
                 (basic_cstring<const_char> *)in_stack_fffffffffffff298);
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_fffffffffffff2a8,
                 (pointer)in_stack_fffffffffffff2a0,(unsigned_long)in_stack_fffffffffffff298);
      in_stack_fffffffffffff298 = (char *)0x0;
      boost::test_tools::tt_detail::report_assertion
                (local_6f8,local_738,local_758,0x6d,CHECK,CHECK_PRED);
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
      ::~lazy_ostream_impl
                ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                  *)in_stack_fffffffffffff298);
      boost::test_tools::assertion_result::~assertion_result
                ((assertion_result *)in_stack_fffffffffffff298);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffff2a8)
      ;
      std::allocator<unsigned_char>::~allocator
                ((allocator<unsigned_char> *)in_stack_fffffffffffff298);
      bVar1 = boost::test_tools::tt_detail::dummy_cond();
    } while (bVar1);
  }
  BlockFilter::BlockFilter(in_stack_fffffffffffff2b0);
  local_7ca._98_8_ = 0;
  uStack_760 = 0;
  local_7ca._82_8_ = 0;
  local_7ca._90_8_ = 0;
  DataStream::DataStream((DataStream *)in_stack_fffffffffffff298);
  DataStream::operator<<((DataStream *)in_stack_fffffffffffff2a8,in_stack_fffffffffffff2a0);
  DataStream::operator>>((DataStream *)in_stack_fffffffffffff2a8,in_stack_fffffffffffff2a0);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff2a8,
               (pointer)in_stack_fffffffffffff2a0,(unsigned_long)in_stack_fffffffffffff298);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff298);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_fffffffffffff2d8._M_extent_value,
               in_stack_fffffffffffff2d0,
               CONCAT44(in_stack_fffffffffffff2cc,in_stack_fffffffffffff2c8),
               (const_string *)in_stack_fffffffffffff2c0);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_fffffffffffff2a0,(char (*) [1])in_stack_fffffffffffff298);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff2a8,
               (pointer)in_stack_fffffffffffff2a0,(unsigned_long)in_stack_fffffffffffff298);
    local_7ca[1] = BlockFilter::GetFilterType((BlockFilter *)in_stack_fffffffffffff298);
    local_7ca[0] = BlockFilter::GetFilterType((BlockFilter *)in_stack_fffffffffffff298);
    in_stack_fffffffffffff2a8 = "block_filter2.GetFilterType()";
    in_stack_fffffffffffff2a0 = (BlockFilter *)local_7ca;
    in_stack_fffffffffffff298 = "block_filter.GetFilterType()";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,BlockFilterType,BlockFilterType>
              (local_7ca + 0x12,local_7ca + 2,0x77,1,2,local_7ca + 1);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_fffffffffffff298);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff2a8,
               (pointer)in_stack_fffffffffffff2a0,(unsigned_long)in_stack_fffffffffffff298);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff298);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_fffffffffffff2d8._M_extent_value,
               in_stack_fffffffffffff2d0,
               CONCAT44(in_stack_fffffffffffff2cc,in_stack_fffffffffffff2c8),
               (const_string *)in_stack_fffffffffffff2c0);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_fffffffffffff2a0,(char (*) [1])in_stack_fffffffffffff298);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff2a8,
               (pointer)in_stack_fffffffffffff2a0,(unsigned_long)in_stack_fffffffffffff298);
    puVar2 = BlockFilter::GetBlockHash((BlockFilter *)in_stack_fffffffffffff298);
    in_stack_fffffffffffff2a0 =
         (BlockFilter *)BlockFilter::GetBlockHash((BlockFilter *)in_stack_fffffffffffff298);
    in_stack_fffffffffffff2a8 = "block_filter2.GetBlockHash()";
    in_stack_fffffffffffff298 = "block_filter.GetBlockHash()";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,uint256,uint256>
              (local_810,local_820,0x78,1,2,puVar2);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_fffffffffffff298);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff2a8,
               (pointer)in_stack_fffffffffffff2a0,(unsigned_long)in_stack_fffffffffffff298);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff298);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_fffffffffffff2d8._M_extent_value,
               in_stack_fffffffffffff2d0,
               CONCAT44(in_stack_fffffffffffff2cc,in_stack_fffffffffffff2c8),
               (const_string *)in_stack_fffffffffffff2c0);
    BlockFilter::GetEncodedFilter((BlockFilter *)in_stack_fffffffffffff298);
    BlockFilter::GetEncodedFilter((BlockFilter *)in_stack_fffffffffffff298);
    std::operator==((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                    CONCAT44(in_stack_fffffffffffff2cc,in_stack_fffffffffffff2c8),
                    (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                    in_stack_fffffffffffff2c0);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_fffffffffffff2a8,
               SUB81((ulong)in_stack_fffffffffffff2a0 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff2a8,
               (pointer)in_stack_fffffffffffff2a0,(unsigned_long)in_stack_fffffffffffff298);
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_fffffffffffff2a0,
               (basic_cstring<const_char> *)in_stack_fffffffffffff298);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff2a8,
               (pointer)in_stack_fffffffffffff2a0,(unsigned_long)in_stack_fffffffffffff298);
    in_stack_fffffffffffff298 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_858,local_878,(const_string *)(local_8ea + 0x52),0x79,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_fffffffffffff298);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_fffffffffffff298);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  BlockFilter::BlockFilter(in_stack_fffffffffffff2b0);
  BlockFilter::BlockFilter(in_stack_fffffffffffff2b0);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff2a8,
               (pointer)in_stack_fffffffffffff2a0,(unsigned_long)in_stack_fffffffffffff298);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff298);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_fffffffffffff2d8._M_extent_value,
               in_stack_fffffffffffff2d0,
               CONCAT44(in_stack_fffffffffffff2cc,in_stack_fffffffffffff2c8),
               (const_string *)in_stack_fffffffffffff2c0);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_fffffffffffff2a0,(char (*) [1])in_stack_fffffffffffff298);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff2a8,
               (pointer)in_stack_fffffffffffff2a0,(unsigned_long)in_stack_fffffffffffff298);
    local_8ea[1] = BlockFilter::GetFilterType((BlockFilter *)in_stack_fffffffffffff298);
    local_8ea[0] = BlockFilter::GetFilterType((BlockFilter *)in_stack_fffffffffffff298);
    in_stack_fffffffffffff2a8 = "default_ctor_block_filter_2.GetFilterType()";
    in_stack_fffffffffffff2a0 = (BlockFilter *)local_8ea;
    in_stack_fffffffffffff298 = "default_ctor_block_filter_1.GetFilterType()";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,BlockFilterType,BlockFilterType>
              (local_8ea + 0x12,local_8ea + 2,0x7d,1,2,local_8ea + 1);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_fffffffffffff298);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff2a8,
               (pointer)in_stack_fffffffffffff2a0,(unsigned_long)in_stack_fffffffffffff298);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff298);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_fffffffffffff2d8._M_extent_value,
               in_stack_fffffffffffff2d0,
               CONCAT44(in_stack_fffffffffffff2cc,in_stack_fffffffffffff2c8),
               (const_string *)in_stack_fffffffffffff2c0);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_fffffffffffff2a0,(char (*) [1])in_stack_fffffffffffff298);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff2a8,
               (pointer)in_stack_fffffffffffff2a0,(unsigned_long)in_stack_fffffffffffff298);
    puVar2 = BlockFilter::GetBlockHash((BlockFilter *)in_stack_fffffffffffff298);
    in_stack_fffffffffffff2a0 =
         (BlockFilter *)BlockFilter::GetBlockHash((BlockFilter *)in_stack_fffffffffffff298);
    in_stack_fffffffffffff2a8 = "default_ctor_block_filter_2.GetBlockHash()";
    in_stack_fffffffffffff298 = "default_ctor_block_filter_1.GetBlockHash()";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,uint256,uint256>
              (local_930,local_940,0x7e,1,2,puVar2);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_fffffffffffff298);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff2a8,
               (pointer)in_stack_fffffffffffff2a0,(unsigned_long)in_stack_fffffffffffff298);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff298);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_fffffffffffff2d8._M_extent_value,
               in_stack_fffffffffffff2d0,
               CONCAT44(in_stack_fffffffffffff2cc,in_stack_fffffffffffff2c8),
               (const_string *)in_stack_fffffffffffff2c0);
    BlockFilter::GetEncodedFilter((BlockFilter *)in_stack_fffffffffffff298);
    BlockFilter::GetEncodedFilter((BlockFilter *)in_stack_fffffffffffff298);
    std::operator==((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                    CONCAT44(in_stack_fffffffffffff2cc,in_stack_fffffffffffff2c8),
                    (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                    in_stack_fffffffffffff2c0);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_fffffffffffff2a8,
               SUB81((ulong)in_stack_fffffffffffff2a0 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff2a8,
               (pointer)in_stack_fffffffffffff2a0,(unsigned_long)in_stack_fffffffffffff298);
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_fffffffffffff2a0,
               (basic_cstring<const_char> *)in_stack_fffffffffffff298);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff2a8,
               (pointer)in_stack_fffffffffffff2a0,(unsigned_long)in_stack_fffffffffffff298);
    in_stack_fffffffffffff298 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_978,local_998,local_9b8,0x7f,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_fffffffffffff298);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_fffffffffffff298);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  BlockFilter::~BlockFilter((BlockFilter *)in_stack_fffffffffffff298);
  BlockFilter::~BlockFilter((BlockFilter *)in_stack_fffffffffffff298);
  DataStream::~DataStream((DataStream *)in_stack_fffffffffffff298);
  BlockFilter::~BlockFilter((BlockFilter *)in_stack_fffffffffffff298);
  BlockFilter::~BlockFilter((BlockFilter *)in_stack_fffffffffffff298);
  CBlockUndo::~CBlockUndo((CBlockUndo *)in_stack_fffffffffffff298);
  CBlock::~CBlock((CBlock *)in_stack_fffffffffffff298);
  CMutableTransaction::~CMutableTransaction((CMutableTransaction *)in_stack_fffffffffffff298);
  CMutableTransaction::~CMutableTransaction((CMutableTransaction *)in_stack_fffffffffffff298);
  local_ce8 = local_a8;
  do {
    local_ce8 = local_ce8 + -4;
    CScript::~CScript((CScript *)in_stack_fffffffffffff298);
  } while (local_ce8 != local_128);
  plVar4 = local_a8;
  plVar3 = &local_8;
  do {
    plVar3 = plVar3 + -4;
    CScript::~CScript((CScript *)in_stack_fffffffffffff298);
  } while (plVar3 != plVar4);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(blockfilter_basic_test)
{
    CScript included_scripts[5], excluded_scripts[4];

    // First two are outputs on a single transaction.
    included_scripts[0] << std::vector<unsigned char>(0, 65) << OP_CHECKSIG;
    included_scripts[1] << OP_DUP << OP_HASH160 << std::vector<unsigned char>(1, 20) << OP_EQUALVERIFY << OP_CHECKSIG;

    // Third is an output on in a second transaction.
    included_scripts[2] << OP_1 << std::vector<unsigned char>(2, 33) << OP_1 << OP_CHECKMULTISIG;

    // Last two are spent by a single transaction.
    included_scripts[3] << OP_0 << std::vector<unsigned char>(3, 32);
    included_scripts[4] << OP_4 << OP_ADD << OP_8 << OP_EQUAL;

    // OP_RETURN output is an output on the second transaction.
    excluded_scripts[0] << OP_RETURN << std::vector<unsigned char>(4, 40);

    // This script is not related to the block at all.
    excluded_scripts[1] << std::vector<unsigned char>(5, 33) << OP_CHECKSIG;

    // OP_RETURN is non-standard since it's not followed by a data push, but is still excluded from
    // filter.
    excluded_scripts[2] << OP_RETURN << OP_4 << OP_ADD << OP_8 << OP_EQUAL;

    CMutableTransaction tx_1;
    tx_1.vout.emplace_back(100, included_scripts[0]);
    tx_1.vout.emplace_back(200, included_scripts[1]);
    tx_1.vout.emplace_back(0, excluded_scripts[0]);

    CMutableTransaction tx_2;
    tx_2.vout.emplace_back(300, included_scripts[2]);
    tx_2.vout.emplace_back(0, excluded_scripts[2]);
    tx_2.vout.emplace_back(400, excluded_scripts[3]); // Script is empty

    CBlock block;
    block.vtx.push_back(MakeTransactionRef(tx_1));
    block.vtx.push_back(MakeTransactionRef(tx_2));

    CBlockUndo block_undo;
    block_undo.vtxundo.emplace_back();
    block_undo.vtxundo.back().vprevout.emplace_back(CTxOut(500, included_scripts[3]), 1000, true);
    block_undo.vtxundo.back().vprevout.emplace_back(CTxOut(600, included_scripts[4]), 10000, false);
    block_undo.vtxundo.back().vprevout.emplace_back(CTxOut(700, excluded_scripts[3]), 100000, false);

    BlockFilter block_filter(BlockFilterType::BASIC, block, block_undo);
    const GCSFilter& filter = block_filter.GetFilter();

    for (const CScript& script : included_scripts) {
        BOOST_CHECK(filter.Match(GCSFilter::Element(script.begin(), script.end())));
    }
    for (const CScript& script : excluded_scripts) {
        BOOST_CHECK(!filter.Match(GCSFilter::Element(script.begin(), script.end())));
    }

    // Test serialization/unserialization.
    BlockFilter block_filter2;

    DataStream stream{};
    stream << block_filter;
    stream >> block_filter2;

    BOOST_CHECK_EQUAL(block_filter.GetFilterType(), block_filter2.GetFilterType());
    BOOST_CHECK_EQUAL(block_filter.GetBlockHash(), block_filter2.GetBlockHash());
    BOOST_CHECK(block_filter.GetEncodedFilter() == block_filter2.GetEncodedFilter());

    BlockFilter default_ctor_block_filter_1;
    BlockFilter default_ctor_block_filter_2;
    BOOST_CHECK_EQUAL(default_ctor_block_filter_1.GetFilterType(), default_ctor_block_filter_2.GetFilterType());
    BOOST_CHECK_EQUAL(default_ctor_block_filter_1.GetBlockHash(), default_ctor_block_filter_2.GetBlockHash());
    BOOST_CHECK(default_ctor_block_filter_1.GetEncodedFilter() == default_ctor_block_filter_2.GetEncodedFilter());
}